

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseVersionNum(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  int max;
  int iVar2;
  xmlParserCtxtPtr pxVar3;
  int newSize;
  xmlChar *tmp;
  int iStack_28;
  xmlChar cur;
  int maxLength;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  iStack_28 = 10;
  max = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    max = 10000000;
  }
  _size = (xmlParserCtxtPtr)(*xmlMalloc)(10);
  if (_size == (xmlParserCtxtPtr)0x0) {
    xmlErrMemory(ctxt);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    bVar1 = *ctxt->input->cur;
    if ((bVar1 < 0x30) || (0x39 < bVar1)) {
      (*xmlFree)(_size);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      *(byte *)&_size->sax = bVar1;
      xmlNextChar(ctxt);
      if (*ctxt->input->cur == '.') {
        *(undefined1 *)((long)&_size->sax + 1) = 0x2e;
        xmlNextChar(ctxt);
        tmp._3_1_ = *ctxt->input->cur;
        maxLength = 2;
        while (0x2f < tmp._3_1_ && tmp._3_1_ < 0x3a) {
          if (iStack_28 <= maxLength + 1) {
            iVar2 = xmlGrowCapacity(iStack_28,1,1,max);
            if (iVar2 != 0) {
              xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"VersionNum");
              (*xmlFree)(_size);
              return (xmlChar *)0x0;
            }
            pxVar3 = (xmlParserCtxtPtr)(*xmlRealloc)(_size,0);
            if (pxVar3 == (xmlParserCtxtPtr)0x0) {
              xmlErrMemory(ctxt);
              (*xmlFree)(_size);
              return (xmlChar *)0x0;
            }
            iStack_28 = 0;
            _size = pxVar3;
          }
          *(byte *)((long)&_size->sax + (long)maxLength) = tmp._3_1_;
          xmlNextChar(ctxt);
          maxLength = maxLength + 1;
          tmp._3_1_ = *ctxt->input->cur;
        }
        *(undefined1 *)((long)&_size->sax + (long)maxLength) = 0;
        ctxt_local = _size;
      }
      else {
        (*xmlFree)(_size);
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

xmlChar *
xmlParseVersionNum(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar cur;

    buf = xmlMalloc(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt);
	return(NULL);
    }
    cur = CUR;
    if (!((cur >= '0') && (cur <= '9'))) {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    if (cur != '.') {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    while ((cur >= '0') && (cur <= '9')) {
	if (len + 1 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "VersionNum");
                xmlFree(buf);
                return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
	        xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	buf[len++] = cur;
	NEXT;
	cur=CUR;
    }
    buf[len] = 0;
    return(buf);
}